

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::detail::SignedCheck<int,true>::operator()
          (SignedCheck<int,_true> *this,bool negative,uint u,string *text)

{
  uint uVar1;
  uint in_EDX;
  undefined1 in_SIL;
  uint uVar2;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  if ((char)(uVar3 >> 0x18) == '\0') {
    uVar2 = in_EDX;
    uVar1 = std::numeric_limits<int>::max();
    if (uVar1 < in_EDX) {
      throw_or_mimic<cxxopts::argument_incorrect_type>((string *)CONCAT44(uVar3,uVar2));
    }
  }
  else {
    uVar2 = in_EDX;
    uVar1 = std::numeric_limits<int>::min();
    if (uVar1 < in_EDX) {
      throw_or_mimic<cxxopts::argument_incorrect_type>((string *)CONCAT44(uVar3,uVar2));
    }
  }
  return;
}

Assistant:

void
        operator()(bool negative, U u, const std::string& text)
        {
          if (negative)
          {
            if (u > static_cast<U>((std::numeric_limits<T>::min)()))
            {
              throw_or_mimic<argument_incorrect_type>(text);
            }
          }
          else
          {
            if (u > static_cast<U>((std::numeric_limits<T>::max)()))
            {
              throw_or_mimic<argument_incorrect_type>(text);
            }
          }
        }